

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

optional<spv::Capability> spvtools::opt::Handler_OpTypeImage_ImageMSArray(Instruction *instruction)

{
  Op OVar1;
  Capability local_28;
  uint32_t local_24;
  uint32_t local_20;
  uint32_t sampled;
  uint32_t ms;
  uint32_t arrayed;
  Instruction *instruction_local;
  
  _ms = instruction;
  OVar1 = Instruction::opcode(instruction);
  if (OVar1 != OpTypeImage) {
    __assert_fail("instruction->opcode() == spv::Op::OpTypeImage && \"This handler only support OpTypeImage opcodes.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,0x136,
                  "std::optional<spv::Capability> spvtools::opt::Handler_OpTypeImage_ImageMSArray(const Instruction *)"
                 );
  }
  sampled = Instruction::GetSingleWordInOperand(_ms,3);
  local_20 = Instruction::GetSingleWordInOperand(_ms,4);
  local_24 = Instruction::GetSingleWordInOperand(_ms,5);
  if (((sampled == 1) && (local_24 == 2)) && (local_20 == 1)) {
    local_28 = ImageMSArray;
    std::optional<spv::Capability>::optional<spv::Capability,_true>
              ((optional<spv::Capability> *)&instruction_local,&local_28);
  }
  else {
    std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
  }
  return (_Optional_base<spv::Capability,_true,_true>)
         (_Optional_base<spv::Capability,_true,_true>)instruction_local;
}

Assistant:

static std::optional<spv::Capability> Handler_OpTypeImage_ImageMSArray(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpTypeImage &&
         "This handler only support OpTypeImage opcodes.");

  const uint32_t arrayed =
      instruction->GetSingleWordInOperand(kOpTypeImageArrayedIndex);
  const uint32_t ms = instruction->GetSingleWordInOperand(kOpTypeImageMSIndex);
  const uint32_t sampled =
      instruction->GetSingleWordInOperand(kOpTypeImageSampledIndex);

  return arrayed == 1 && sampled == 2 && ms == 1
             ? std::optional(spv::Capability::ImageMSArray)
             : std::nullopt;
}